

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigSplit.c
# Opt level: O0

Aig_Man_t * Aig_ManConvertBddsToAigs(Aig_Man_t *p,DdManager *dd,Vec_Ptr_t *vCofs)

{
  int iVar1;
  Aig_Man_t *p_00;
  char *pcVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  st__table *table;
  DdNode *pDVar6;
  DdNode *pDVar7;
  int local_44;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  st__table *tBdd2Node;
  DdNode *bFunc;
  Vec_Ptr_t *vCofs_local;
  DdManager *dd_local;
  Aig_Man_t *p_local;
  
  Aig_ManCleanData(p);
  iVar1 = Aig_ManObjNum(p);
  p_00 = Aig_ManStart(iVar1);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  pAVar3 = Aig_ManConst1(p_00);
  pAVar4 = Aig_ManConst1(p);
  (pAVar4->field_5).pData = pAVar3;
  for (local_44 = 0; iVar1 = Vec_PtrSize(p->vCis), local_44 < iVar1; local_44 = local_44 + 1) {
    pvVar5 = Vec_PtrEntry(p->vCis,local_44);
    pAVar3 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar3;
  }
  table = st__init_table(st__ptrcmp,st__ptrhash);
  pDVar6 = Cudd_ReadOne(dd);
  pAVar3 = Aig_ManConst1(p_00);
  st__insert(table,(char *)pDVar6,(char *)pAVar3);
  for (local_44 = 0; iVar1 = Vec_PtrSize(p->vCis), local_44 < iVar1; local_44 = local_44 + 1) {
    pvVar5 = Vec_PtrEntry(p->vCis,local_44);
    pDVar6 = Cudd_bddIthVar(dd,local_44);
    st__insert(table,(char *)pDVar6,*(char **)((long)pvVar5 + 0x28));
  }
  for (local_44 = 0; iVar1 = Vec_PtrSize(vCofs), local_44 < iVar1; local_44 = local_44 + 1) {
    pDVar6 = (DdNode *)Vec_PtrEntry(vCofs,local_44);
    pDVar7 = Cudd_ReadLogicZero(dd);
    if (pDVar6 != pDVar7) {
      pAVar3 = Aig_NodeBddToMuxes_rec(dd,(DdNode *)((ulong)pDVar6 & 0xfffffffffffffffe),p_00,table);
      pAVar3 = Aig_NotCond(pAVar3,(uint)pDVar6 & 1);
      Aig_ObjCreateCo(p_00,pAVar3);
    }
  }
  st__free_table(table);
  for (local_44 = 0; iVar1 = Vec_PtrSize(p->vCos), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_44);
    if (local_44 != 0) {
      pAVar4 = Aig_ObjFanin0(pAVar3);
      Aig_ManDupSimpleDfs_rec(p_00,p,pAVar4);
      pAVar4 = Aig_ObjChild0Copy(pAVar3);
      pAVar4 = Aig_ObjCreateCo(p_00,pAVar4);
      (pAVar3->field_5).pData = pAVar4;
    }
  }
  Aig_ManCleanup(p_00);
  iVar1 = Aig_ManRegNum(p);
  Aig_ManSetRegNum(p_00,iVar1);
  iVar1 = Aig_ManCheck(p_00);
  if (iVar1 == 0) {
    printf("Aig_ManConvertBddsToAigs(): The check has failed.\n");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManConvertBddsToAigs( Aig_Man_t * p, DdManager * dd, Vec_Ptr_t * vCofs )
{
    DdNode * bFunc;
    st__table * tBdd2Node;
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    Aig_ManCleanData( p );
    // generate AIG for BDD
    pNew = Aig_ManStart( Aig_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // create the table mapping BDD nodes into the ABC nodes
    tBdd2Node = st__init_table( st__ptrcmp, st__ptrhash );
    // add the constant and the elementary vars
    st__insert( tBdd2Node, (char *)Cudd_ReadOne(dd), (char *)Aig_ManConst1(pNew) );
    Aig_ManForEachCi( p, pObj, i )
        st__insert( tBdd2Node, (char *)Cudd_bddIthVar(dd, i), (char *)pObj->pData );
    // build primary outputs for the cofactors
    Vec_PtrForEachEntry( DdNode *, vCofs, bFunc, i )
    {
        if ( bFunc == Cudd_ReadLogicZero(dd) )
            continue;
        pObj = Aig_NodeBddToMuxes_rec( dd, Cudd_Regular(bFunc), pNew, tBdd2Node );
        pObj = Aig_NotCond( pObj, Cudd_IsComplement(bFunc) );
        Aig_ObjCreateCo( pNew, pObj );
    }
    st__free_table( tBdd2Node );

    // duplicate the rest of the AIG
    // add the POs
    Aig_ManForEachCo( p, pObj, i )
    {
        if ( i == 0 )
            continue;
        Aig_ManDupSimpleDfs_rec( pNew, p, Aig_ObjFanin0(pObj) );
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    Aig_ManCleanup( pNew );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManConvertBddsToAigs(): The check has failed.\n" );
    return pNew;
}